

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O1

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::Expand
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,BGIP_BnB_NodePtr *node,Index JA)

{
  uint jTypeI;
  pointer pvVar1;
  long lVar2;
  sp_counted_base *psVar3;
  element_type *peVar4;
  BGIP_BnB_Node *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  ostream *poVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  BGIP_BnB_NodePtr nodeExtend;
  shared_ptr<BGIP_BnB_Node> local_78;
  double local_68;
  BGIP_BnB_NodePtr local_60;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pvVar1 = (this->_m_jaToIndCache).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (BGIP_BnB_Node *)operator_new(0x40);
  BGIP_BnB_Node::BGIP_BnB_Node(this_00,node->px);
  boost::shared_ptr<BGIP_BnB_Node>::shared_ptr<BGIP_BnB_Node>(&local_78,this_00);
  *(int *)&((shared_ptr<BGIP_BnB_Node> *)((long)local_78.px + 0x20))->px =
       *(int *)(node->px + 0x20) + 1;
  boost::shared_ptr<BGIP_BnB_Node>::operator=((shared_ptr<BGIP_BnB_Node> *)local_78.px,node);
  this->_m_nrNodesExpanded = this->_m_nrNodesExpanded + 1;
  jTypeI = (this->_m_jtIndexMapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start[*(uint *)(node->px + 0x20)];
  pvVar5 = BayesianGameBase::JointToIndividualTypeIndices
                     ((BayesianGameBase *)(this->_m_bgip).px,jTypeI);
  lVar7 = (long)(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    lVar2 = *(long *)&pvVar1[JA].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data;
    psVar3 = (((shared_ptr<BGIP_BnB_Node> *)((long)local_78.px + 0x20))->pn).pi_;
    uVar8 = 0;
    do {
      *(undefined4 *)((long)&psVar3->_vptr_sp_counted_base + uVar8 * 4) =
           *(undefined4 *)(lVar2 + uVar8 * 4);
      uVar8 = uVar8 + 1;
    } while (lVar7 >> 2 != (uVar8 & 0xffffffff));
  }
  if (this->_m_reComputeH == false) {
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         (this->_m_completeInformationValues).super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_start[jTypeI];
    auVar9._8_8_ = 0x8000000000000000;
    auVar9._0_8_ = 0x8000000000000000;
    auVar9 = vxorpd_avx512vl(auVar11,auVar9);
    BGIP_BnB_Node::UpdateH(auVar9._0_8_);
  }
  else {
    local_60.px = local_78.px;
    local_60.pn.pi_ = local_78.pn.pi_;
    if (local_78.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_78.pn.pi_)->use_count_ = (local_78.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    ReComputeH(this,&local_60);
    boost::detail::shared_count::~shared_count(&local_60.pn);
  }
  peVar4 = (this->_m_bgip).px;
  local_68 = (double)(**(code **)(*(long *)peVar4 + 0x68))(peVar4,jTypeI);
  peVar4 = (this->_m_bgip).px;
  dVar10 = (double)(**(code **)(*(long *)peVar4 + 0x80))(peVar4,(ulong)jTypeI,JA);
  BGIP_BnB_Node::UpdateG(dVar10 * local_68);
  if (4 < this->_m_verbosity) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BGIP_SolverBranchAndBound Adding node: ",0x27);
    BGIP_BnB_Node::SoftPrint_abi_cxx11_();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_50,local_48);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  if (this->_m_CBGlowerBound <= *(double *)(node->px + 0x10) + *(double *)(node->px + 0x18)) {
    std::
    priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
    ::push(this->_m_openQueue,&local_78);
  }
  else {
    this->_m_nrNodesPruned = this->_m_nrNodesPruned + 1;
  }
  boost::detail::shared_count::~shared_count(&local_78.pn);
  return;
}

Assistant:

void Expand(BGIP_BnB_NodePtr node, Index JA)
    {
        const std::vector<Index> &ja=_m_jaToIndCache[JA];
        
        // Create a new node, copy from its parent
        BGIP_BnB_NodePtr nodeExtend=BGIP_BnB_NodePtr(new BGIP_BnB_Node(*node));

        nodeExtend->SetDepth( node->GetDepth() + 1 );
#if INCR_EXPAND
        nodeExtend->ClearAlreadyExpanded();
#endif
        nodeExtend->SetParent(node);
        _m_nrNodesExpanded++;
        
        //jt_oI of *nodeExtended* is *node*->GetDepth
        Index jt_oI = node->GetDepth();
        Index jt_bgI = _m_jtIndexMapping[jt_oI];
        
        // update the new nodes joint policy
        const std::vector<Index> &indTypes=
            _m_bgip->JointToIndividualTypeIndices(jt_bgI);
        for(Index agI=0;agI!=indTypes.size();++agI)
        {
#if MAINTAIN_FULL_POL        
            nodeExtend->SetAction(agI,indTypes[agI],ja[agI]);
#else
            nodeExtend->SetAction(agI,ja[agI]);
#endif

#if CACHE_IMPLIED_JPOL
            //update the implied policy:
            //(this is used by ReComputeH below!)
            _m_impliedJPol[agI][ indTypes[agI] ] = ja[agI];
#endif
        }
        
        // update the G and H values, which automatically updates F:
        if(_m_reComputeH)
            ReComputeH(nodeExtend);
        else
        {
            // first we substract the heuristic CI value for the
            // current joint type
            nodeExtend->UpdateH(-_m_completeInformationValues[jt_bgI]);
        }
        // then we add the real value to G
        nodeExtend->UpdateG(GetContribution(jt_bgI,JA));
                
        if(_m_verbosity>4)
            std::cout << "BGIP_SolverBranchAndBound Adding node: "
                      << nodeExtend->SoftPrint() << std::endl;
        
#if INCR_EXPAND
        // keep track of already expanded nodes
        node->SetAlreadyExpanded(JA);
#endif

        if(node->GetF() < _m_CBGlowerBound)
            _m_nrNodesPruned++; // do nothing, by not putting it on the
                                // queue it will be deleted
        else
            // add the node to the queue
            _m_openQueue->push(nodeExtend);
    }